

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Promise<void> __thiscall
capnp::LocalClient::callInternal
          (LocalClient *this,uint64_t interfaceId,uint16_t methodId,CallContextHook *context)

{
  undefined8 *puVar1;
  SourceLocation location;
  undefined6 in_register_00000012;
  long *in_R8;
  DebugExpression<bool> _kjCondition;
  DispatchCallResult result;
  Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t> local_218;
  undefined1 local_208 [16];
  Own<capnp::CallContextHook,_std::nullptr_t> local_1f8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_1e8;
  OwnPromiseNode local_1e0;
  char *local_1d8;
  char *pcStack_1d0;
  char *local_1c8;
  char *local_1c0;
  char *pcStack_1b8;
  OwnPromiseNode local_1b0;
  Exception local_1a8;
  
  local_218.disposer._0_1_ = *(byte *)(interfaceId + 0x78) ^ 1;
  if (*(byte *)(interfaceId + 0x78) != 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
               ,0x358,FAILED,"!blocked","_kjCondition,",(DebugExpression<bool> *)&local_218);
    kj::_::Debug::Fault::fatal((Fault *)&local_1a8);
  }
  if (*(char *)(interfaceId + 0x80) == '\x01') {
    kj::Exception::Exception(&local_1a8,(Exception *)(interfaceId + 0x88));
    kj::Promise<void>::Promise((Promise<void> *)this,&local_1a8);
    kj::Exception::~Exception(&local_1a8);
  }
  else {
    puVar1 = *(undefined8 **)(interfaceId + 0x28);
    if (puVar1 == (undefined8 *)0x0) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
                 ,0x360,FAILED,"server != nullptr","");
      kj::_::Debug::Fault::fatal((Fault *)&local_218);
    }
    (**(code **)*puVar1)
              (&local_1a8,puVar1,CONCAT62(in_register_00000012,methodId),(ulong)context & 0xffff);
    if (*(char *)(interfaceId + 0x68) == '\x01') {
      local_1e0.ptr = (PromiseNode *)local_1a8.ownFile.content.ptr;
      local_1a8.ownFile.content.ptr = (char *)0x0;
      kj::newAdaptedPromise<void,kj::Canceler::AdapterImpl<void>,kj::Canceler&,kj::Promise<void>>
                ((kj *)&local_218,(Canceler *)(interfaceId + 0x70),(Promise<void> *)&local_1e0);
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_1a8,
                 (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_218);
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_218);
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1e0);
    }
    if (local_1a8.ownFile.content.size_._1_1_ == '\0') {
      *(int *)(interfaceId + 0x18) = *(int *)(interfaceId + 0x18) + 1;
      local_208._0_8_ = interfaceId + 0x10;
      local_208._8_8_ = interfaceId;
      (**(code **)(*in_R8 + 0x38))(local_208 + 0x10);
      kj::Promise<void>::
      attach<kj::Own<capnp::LocalClient,decltype(nullptr)>,kj::Own<capnp::CallContextHook,decltype(nullptr)>>
                ((Promise<void> *)&local_1e8,(Own<capnp::LocalClient,_std::nullptr_t> *)&local_1a8,
                 (Own<capnp::CallContextHook,_std::nullptr_t> *)local_208);
      local_1c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
      ;
      pcStack_1b8 = "callInternal";
      local_1b0.ptr = (PromiseNode *)0x1300000369;
      kj::Promise<void>::fork((Promise<void> *)&local_218);
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_1e8);
      kj::Own<capnp::CallContextHook,_std::nullptr_t>::dispose
                ((Own<capnp::CallContextHook,_std::nullptr_t> *)(local_208 + 0x10));
      kj::Own<capnp::LocalClient,_std::nullptr_t>::dispose
                ((Own<capnp::LocalClient,_std::nullptr_t> *)local_208);
      kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_208);
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_1a8,
                 (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_208);
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_208);
      kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_208);
      kj::Promise<void>::
      detach<capnp::LocalClient::callInternal(unsigned_long,unsigned_short,capnp::CallContextHook&)::_lambda(kj::Exception&&)_1_>
                ((Promise<void> *)local_208,
                 (anon_class_1_0_00000001_for_errorHandler *)(local_208 + 0x10));
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_208);
      kj::Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t>::dispose(&local_218);
    }
    if ((char)local_1a8.ownFile.content.size_ == '\x01') {
      local_1d8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
      ;
      pcStack_1d0 = "callInternal";
      local_1c8 = (char *)0xe00000372;
      location.function = "callInternal";
      location.fileName =
           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
      ;
      location.lineNumber = 0x372;
      location.columnNumber = 0xe;
      local_208._0_8_ = interfaceId;
      kj::Promise<void>::
      catch_<capnp::LocalClient::callInternal(unsigned_long,unsigned_short,capnp::CallContextHook&)::_lambda(kj::Exception&&)_2_>
                ((Promise<void> *)&local_218,(anon_class_8_1_8991fb9c_for_errorHandler *)&local_1a8,
                 location);
      *(undefined1 *)(interfaceId + 0x78) = 1;
      local_1f8.disposer = (Disposer *)interfaceId;
      kj::Promise<void>::attach<capnp::LocalClient::BlockingScope>
                ((Promise<void> *)this,(BlockingScope *)&local_218);
      BlockingScope::~BlockingScope((BlockingScope *)(local_208 + 0x10));
      kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_218);
    }
    else {
      (this->super_ClientHook)._vptr_ClientHook = (_func_int **)local_1a8.ownFile.content.ptr;
      local_1a8.ownFile.content.ptr = (char *)0x0;
    }
    kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_1a8);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> callInternal(uint64_t interfaceId, uint16_t methodId,
                                 CallContextHook& context) {
    KJ_ASSERT(!blocked);

    KJ_IF_SOME(e, brokenException) {
      // Previous streaming call threw, so everything fails from now on.
      return kj::cp(e);
    }

    // `server` can't be null here since `brokenException` is null.
    auto result = KJ_ASSERT_NONNULL(server)->dispatchCall(interfaceId, methodId,
                                       CallContext<AnyPointer, AnyPointer>(context));

    KJ_IF_SOME(r, revoker) {
      result.promise = r.wrap(kj::mv(result.promise));
    }

    if (!result.allowCancellation) {
      // Make sure this call cannot be canceled by forking the promise and detaching one branch.
      auto fork = result.promise.attach(kj::addRef(*this), context.addRef()).fork();
      result.promise = fork.addBranch();
      fork.addBranch().detach([](kj::Exception&&) {
        // Exception from canceled call is silently discarded. The caller should have waited for
        // it if they cared.
      });
    }

    if (result.isStreaming) {
      return result.promise
          .catch_([this](kj::Exception&& e) {
        brokenException = kj::cp(e);
        kj::throwRecoverableException(kj::mv(e));
      }).attach(BlockingScope(*this));
    } else {
      return kj::mv(result.promise);
    }
  }